

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

MinLayerParams * __thiscall
CoreML::Specification::MinLayerParams::New(MinLayerParams *this,Arena *arena)

{
  MinLayerParams *this_00;
  
  this_00 = (MinLayerParams *)operator_new(0x18);
  MinLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::MinLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

MinLayerParams* MinLayerParams::New(::google::protobuf::Arena* arena) const {
  MinLayerParams* n = new MinLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}